

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::recoveredgebyflips
          (tetgenmesh *this,point startpt,point endpt,face *sedge,triface *searchtet,int fullsearch)

{
  bool bVar1;
  interresult iVar2;
  int iVar3;
  uint uVar4;
  point pdVar5;
  point pdVar6;
  point pdVar7;
  point pdVar8;
  point pdVar9;
  uint local_1b8;
  int j;
  int i;
  int t1ver;
  int success;
  int pos;
  int poss [4];
  int types [2];
  interresult dir1;
  badface bakface;
  point pd;
  point pc;
  point pb;
  point pa;
  triface spintet;
  triface neightet;
  undefined1 local_b8 [4];
  interresult dir;
  flipconstraints fc;
  int fullsearch_local;
  triface *searchtet_local;
  face *sedge_local;
  point endpt_local;
  point startpt_local;
  tetgenmesh *this_local;
  
  fc.remvert._4_4_ = fullsearch;
  flipconstraints::flipconstraints((flipconstraints *)local_b8);
  fc.cosdihed_out._0_4_ = 1;
  fc._64_8_ = startpt;
  fc.seg[0] = endpt;
LAB_0014bad1:
  do {
    point2tetorg(this,startpt,searchtet);
    iVar2 = finddirection(this,searchtet,endpt);
    if (iVar2 == ACROSSVERT) {
      pdVar5 = dest(this,searchtet);
      if (pdVar5 == endpt) {
        return 1;
      }
      if (sedge == (face *)0x0) {
        return 0;
      }
      iVar3 = report_selfint_edge(this,startpt,endpt,sedge,searchtet,ACROSSVERT);
      return iVar3;
    }
    enextesymself(this,searchtet);
    if (iVar2 == ACROSSFACE) {
      if (((this->checksubfaceflag != 0) && (searchtet->tet[9] != (tetrahedron)0x0)) &&
         (searchtet->tet[9][(int)(searchtet->ver & 3)] != (double *)0x0)) {
        if (sedge == (face *)0x0) {
          return 0;
        }
        iVar3 = report_selfint_edge(this,startpt,endpt,sedge,searchtet,ACROSSFACE);
        return iVar3;
      }
      iVar3 = removefacebyflips(this,searchtet,(flipconstraints *)local_b8);
      if (iVar3 != 0) goto LAB_0014bad1;
    }
    else if (iVar2 == ACROSSEDGE) {
      if (((this->checksubsegflag != 0) && (searchtet->tet[8] != (tetrahedron)0x0)) &&
         (searchtet->tet[8][ver2edge[searchtet->ver]] != (double *)0x0)) {
        if (sedge == (face *)0x0) {
          return 0;
        }
        iVar3 = report_selfint_edge(this,startpt,endpt,sedge,searchtet,ACROSSEDGE);
        return iVar3;
      }
      iVar3 = removeedgebyflips(this,searchtet,(flipconstraints *)local_b8);
      if (iVar3 == 2) goto LAB_0014bad1;
    }
    if (fc.remvert._4_4_ == 0) {
      return 0;
    }
    triface::triface((triface *)&spintet.ver);
    triface::triface((triface *)&pa);
    badface::badface((badface *)(types + 1));
    t1ver = 0;
    bVar1 = false;
    point2tetorg(this,startpt,searchtet);
    neightet._12_4_ = finddirection(this,searchtet,endpt);
    enextesymself(this,searchtet);
    do {
      do {
        iVar3 = searchtet->ver;
        decode(this,searchtet->tet[(int)(searchtet->ver & 3)],searchtet);
        searchtet->ver = fsymtbl[iVar3][searchtet->ver];
        if (neightet._12_4_ == 9) {
          triface::operator=((triface *)&spintet.ver,searchtet);
          uVar4 = (uint)neightet.tet & 3;
          local_1b8 = uVar4;
          while (local_1b8 = local_1b8 + 1, (int)local_1b8 < (int)(uVar4 + 4)) {
            neightet.tet._0_4_ = (int)local_1b8 % 4;
            pdVar5 = org(this,(triface *)&spintet.ver);
            pdVar6 = dest(this,(triface *)&spintet.ver);
            pdVar7 = apex(this,(triface *)&spintet.ver);
            pdVar8 = oppo(this,(triface *)&spintet.ver);
            iVar3 = tri_edge_test(this,pdVar5,pdVar6,pdVar7,startpt,endpt,pdVar8,1,poss + 3,&success
                                 );
            if (iVar3 != 0) {
              neightet._12_4_ = poss[3];
              t1ver = success;
              break;
            }
            neightet._12_4_ = 0;
            t1ver = 0;
          }
          if (neightet._12_4_ == 0) {
            terminatetetgen(this,2);
          }
        }
        else {
          if (neightet._12_4_ == 8) {
            do {
              for (local_1b8 = 0; (int)local_1b8 < 2; local_1b8 = local_1b8 + 1) {
                if (local_1b8 == 0) {
                  enextesym(this,searchtet,(triface *)&spintet.ver);
                }
                else {
                  eprevesym(this,searchtet,(triface *)&spintet.ver);
                }
                pdVar5 = org(this,(triface *)&spintet.ver);
                pdVar6 = dest(this,(triface *)&spintet.ver);
                pdVar7 = apex(this,(triface *)&spintet.ver);
                pdVar8 = oppo(this,(triface *)&spintet.ver);
                iVar3 = tri_edge_test(this,pdVar5,pdVar6,pdVar7,startpt,endpt,pdVar8,1,poss + 3,
                                      &success);
                if (iVar3 != 0) {
                  neightet._12_4_ = poss[3];
                  t1ver = success;
                  break;
                }
                neightet._12_4_ = 0;
                t1ver = 0;
              }
              if (neightet._12_4_ != 0) goto LAB_0014c12e;
              iVar3 = searchtet->ver;
              decode(this,searchtet->tet[facepivot1[searchtet->ver]],searchtet);
              searchtet->ver = facepivot2[iVar3][searchtet->ver];
            } while( true );
          }
          terminatetetgen(this,2);
        }
LAB_0014c12e:
        for (local_1b8 = 0; (int)local_1b8 < t1ver; local_1b8 = local_1b8 + 1) {
          enextself(this,(triface *)&spintet.ver);
        }
        if (neightet._12_4_ == 2) {
          pdVar5 = org(this,(triface *)&spintet.ver);
          if (pdVar5 == endpt) goto LAB_0014c657;
          terminatetetgen(this,2);
        }
        triface::operator=(searchtet,(triface *)&spintet.ver);
        pdVar5 = org(this,searchtet);
        pdVar6 = dest(this,searchtet);
        pdVar7 = apex(this,searchtet);
        pdVar8 = oppo(this,searchtet);
        if (neightet._12_4_ == 9) {
          if (((this->checksubfaceflag != 0) && (searchtet->tet[9] != (tetrahedron)0x0)) &&
             (searchtet->tet[9][(int)(searchtet->ver & 3)] != (double *)0x0)) {
            if (sedge == (face *)0x0) {
              return 0;
            }
            iVar3 = report_selfint_edge(this,startpt,endpt,sedge,searchtet,ACROSSFACE);
            return iVar3;
          }
          iVar3 = removefacebyflips(this,searchtet,(flipconstraints *)local_b8);
          if (iVar3 != 0) {
            bVar1 = true;
            goto LAB_0014c657;
          }
        }
        else if (neightet._12_4_ == 8) {
          if (((this->checksubsegflag != 0) && (searchtet->tet[8] != (tetrahedron)0x0)) &&
             (searchtet->tet[8][ver2edge[searchtet->ver]] != (double *)0x0)) {
            if (sedge == (face *)0x0) {
              return 0;
            }
            iVar3 = report_selfint_edge(this,startpt,endpt,sedge,searchtet,ACROSSEDGE);
            return iVar3;
          }
          iVar3 = removeedgebyflips(this,searchtet,(flipconstraints *)local_b8);
          if (iVar3 == 2) {
            bVar1 = true;
            goto LAB_0014c657;
          }
        }
        else if (neightet._12_4_ == 7) {
          if (sedge == (face *)0x0) {
            return 0;
          }
          terminatetetgen(this,2);
        }
        else {
          terminatetetgen(this,2);
        }
      } while (((searchtet->tet != (tetrahedron *)0x0) &&
               (pdVar9 = org(this,searchtet), pdVar9 == pdVar5)) &&
              ((pdVar9 = dest(this,searchtet), pdVar9 == pdVar6 &&
               ((pdVar9 = apex(this,searchtet), pdVar9 == pdVar7 &&
                (pdVar9 = oppo(this,searchtet), pdVar9 == pdVar8))))));
      point2tetorg(this,pdVar5,searchtet);
      types[0] = finddirection(this,searchtet,pdVar6);
      if (types[0] == ACROSSVERT) {
        pdVar5 = dest(this,searchtet);
        if (pdVar5 == pdVar6) {
          triface::operator=((triface *)&pa,searchtet);
          do {
            pdVar5 = apex(this,(triface *)&pa);
            iVar3 = (int)spintet.tet;
            if (pdVar5 == pdVar7) {
              triface::operator=(searchtet,(triface *)&pa);
              goto LAB_0014c56f;
            }
            decode(this,(tetrahedron)pa[facepivot1[(int)spintet.tet]],(triface *)&pa);
            spintet.tet._0_4_ = facepivot2[iVar3][(int)spintet.tet];
          } while ((tetrahedron *)pa != searchtet->tet);
          searchtet->tet = (tetrahedron *)0x0;
LAB_0014c56f:
          if ((searchtet->tet != (tetrahedron *)0x0) &&
             (pdVar5 = oppo(this,searchtet), pdVar5 != pdVar8)) {
            iVar3 = searchtet->ver;
            decode(this,searchtet->tet[(int)(searchtet->ver & 3)],searchtet);
            searchtet->ver = fsymtbl[iVar3][searchtet->ver];
            pdVar5 = oppo(this,searchtet);
            if (pdVar5 != pdVar8) {
              searchtet->tet = (tetrahedron *)0x0;
              goto LAB_0014c657;
            }
          }
        }
        else {
          searchtet->tet = (tetrahedron *)0x0;
        }
      }
      else {
        searchtet->tet = (tetrahedron *)0x0;
      }
    } while (searchtet->tet != (tetrahedron *)0x0);
    bVar1 = false;
LAB_0014c657:
    if (!bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

int tetgenmesh::recoveredgebyflips(point startpt, point endpt, face *sedge,
                                   triface* searchtet, int fullsearch)
{
  flipconstraints fc;
  enum interresult dir;

  fc.seg[0] = startpt;
  fc.seg[1] = endpt;
  fc.checkflipeligibility = 1;

  // The mainloop of the edge reocvery.
  while (1) { // Loop I

    // Search the edge from 'startpt'.
    point2tetorg(startpt, *searchtet);
    dir = finddirection(searchtet, endpt);
    if (dir == ACROSSVERT) {
      if (dest(*searchtet) == endpt) {
        return 1; // Edge is recovered.
      } else {
        if (sedge) {
          return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
        } else {
          return 0;
        }
      }
    }

    // The edge is missing. 

    // Try to remove the first intersecting face/edge.
    enextesymself(*searchtet); // Go to the opposite face.
    if (dir == ACROSSFACE) {
      if (checksubfaceflag) {
        if (issubface(*searchtet)) {
          if (sedge) {
            return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
          } else {
            return 0; // Cannot flip a subface.
          }
        }
      }
      // Try to flip a crossing face.
      if (removefacebyflips(searchtet, &fc)) {
        continue;
      }
    } else if (dir == ACROSSEDGE) {
      if (checksubsegflag) {
        if (issubseg(*searchtet)) {
          if (sedge) {
            return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
          } else {
            return 0; // Cannot flip a segment.
          }
        }
      }
      // Try to flip an intersecting edge.
      if (removeedgebyflips(searchtet, &fc) == 2) {
        continue;
      }
    }

    // The edge is missing.

    if (fullsearch) {
      // Try to flip one of the faces/edges which intersects the edge.
      triface neightet, spintet;
      point pa, pb, pc, pd;
      badface bakface;
      enum interresult dir1;
      int types[2], poss[4], pos = 0;
      int success = 0;
      int t1ver; 
      int i, j;

      // Loop through the sequence of intersecting faces/edges from
      //   'startpt' to 'endpt'.
      point2tetorg(startpt, *searchtet);
      dir = finddirection(searchtet, endpt);

      // Go to the face/edge intersecting the searching edge.
      enextesymself(*searchtet); // Go to the opposite face.
      // This face/edge has been tried in previous step.

      while (1) { // Loop I-I

        // Find the next intersecting face/edge.
        fsymself(*searchtet);
        if (dir == ACROSSFACE) {
          neightet = *searchtet;
          j = (neightet.ver & 3); // j is the current face number.
          for (i = j + 1; i < j + 4; i++) {
            neightet.ver = (i % 4);
            pa = org(neightet);
            pb = dest(neightet);
            pc = apex(neightet);
            pd = oppo(neightet); // The above point.
            if (tri_edge_test(pa,pb,pc,startpt,endpt, pd, 1, types, poss)) {
              dir = (enum interresult) types[0];
              pos = poss[0];
              break;
            } else {
              dir = DISJOINT;
              pos = 0;
            }
          } // i
          // There must be an intersection face/edge.
          if (dir == DISJOINT) {
            terminatetetgen(this, 2);
          }
        } else if (dir == ACROSSEDGE) {
          while (1) { // Loop I-I-I
            // Check the two opposite faces (of the edge) in 'searchtet'.  
            for (i = 0; i < 2; i++) {
              if (i == 0) {
                enextesym(*searchtet, neightet);
              } else {
                eprevesym(*searchtet, neightet);
              }
              pa = org(neightet);
              pb = dest(neightet);
              pc = apex(neightet);
              pd = oppo(neightet); // The above point.
              if (tri_edge_test(pa,pb,pc,startpt,endpt,pd,1, types, poss)) {
                dir = (enum interresult) types[0];
                pos = poss[0];
                break; // for loop
              } else {
                dir = DISJOINT;
                pos = 0;
              }
            } // i
            if (dir != DISJOINT) {
              // Find an intersection face/edge.
              break;  // Loop I-I-I
            }
            // No intersection. Rotate to the next tet at the edge.
            fnextself(*searchtet);
          } // while (1) // Loop I-I-I
        } else {
          terminatetetgen(this, 2); // Report a bug
        }

        // Adjust to the intersecting edge/vertex.
        for (i = 0; i < pos; i++) {
          enextself(neightet);
        }

        if (dir == SHAREVERT) {
          // Check if we have reached the 'endpt'.
          pd = org(neightet);
          if (pd == endpt) {
            // Failed to recover the edge.
            break; // Loop I-I
          } else {
            terminatetetgen(this, 2); // Report a bug
          }
        }

        // The next to be flipped face/edge.
        *searchtet = neightet;

        // Bakup this face (tetrahedron).
        bakface.forg = org(*searchtet);
        bakface.fdest = dest(*searchtet);
        bakface.fapex = apex(*searchtet);
        bakface.foppo = oppo(*searchtet);

        // Try to flip this intersecting face/edge.
        if (dir == ACROSSFACE) {
          if (checksubfaceflag) {
            if (issubface(*searchtet)) {
              if (sedge) {
                return report_selfint_edge(startpt,endpt,sedge,searchtet,dir);
              } else {
                return 0; // Cannot flip a subface.
              }
            }
          }
          if (removefacebyflips(searchtet, &fc)) {
            success = 1;
            break; // Loop I-I 
          }
        } else if (dir == ACROSSEDGE) {
          if (checksubsegflag) {
            if (issubseg(*searchtet)) {
              if (sedge) {
                return report_selfint_edge(startpt,endpt,sedge,searchtet,dir);
              } else {
                return 0; // Cannot flip a segment.
              }
            }
          }
          if (removeedgebyflips(searchtet, &fc) == 2) {
            success = 1;
            break; // Loop I-I
          }
        } else if (dir == ACROSSVERT) {
          if (sedge) {
            //return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
            terminatetetgen(this, 2);
          } else {
            return 0;
          }
        } else {
          terminatetetgen(this, 2); 
        }

        // The face/edge is not flipped.
        if ((searchtet->tet == NULL) ||
            (org(*searchtet) != bakface.forg) ||
            (dest(*searchtet) != bakface.fdest) ||
            (apex(*searchtet) != bakface.fapex) ||
            (oppo(*searchtet) != bakface.foppo)) {
          // 'searchtet' was flipped. We must restore it.
          point2tetorg(bakface.forg, *searchtet);
          dir1 = finddirection(searchtet, bakface.fdest);
          if (dir1 == ACROSSVERT) {
            if (dest(*searchtet) == bakface.fdest) {
              spintet = *searchtet;
              while (1) {
                if (apex(spintet) == bakface.fapex) {
                  // Found the face.
                  *searchtet = spintet;
                  break;
                }
                fnextself(spintet);
                if (spintet.tet == searchtet->tet) {
                  searchtet->tet = NULL;
                  break; // Not find.
                }
	          } // while (1)
              if (searchtet->tet != NULL) {
                if (oppo(*searchtet) != bakface.foppo) {
                  fsymself(*searchtet);
                  if (oppo(*searchtet) != bakface.foppo) {
                    // The original (intersecting) tet has been flipped.
                    searchtet->tet = NULL;
                    break; // Not find.
                  }
                }
              }
            } else {
              searchtet->tet = NULL; // Not find.
            }
          } else {
            searchtet->tet = NULL; // Not find.
          }
          if (searchtet->tet == NULL) {
            success = 0; // This face/edge has been destroyed.
            break; // Loop I-I 
          }
        }
      } // while (1) // Loop I-I

      if (success) {
        // One of intersecting faces/edges is flipped.
        continue;
      }

    } // if (fullsearch)

    // The edge is missing.
    break; // Loop I

  } // while (1) // Loop I

  return 0;
}